

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu540c.c
# Opt level: O0

MPP_RET hal_jpege_v540c_init(void *hal,MppEncHalCfg *cfg)

{
  MPP_RET MVar1;
  void *pvVar2;
  jpegeV540cHalContext *ctx;
  MPP_RET ret;
  MppEncHalCfg *cfg_local;
  void *hal_local;
  
  mpp_env_get_u32("hal_jpege_debug",&hal_jpege_debug,0);
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_v540c","(%d) enter\n","hal_jpege_v540c_init",0x50);
  }
  pvVar2 = mpp_osal_calloc("hal_jpege_v540c_init",0x254);
  *(void **)((long)hal + 0x78) = pvVar2;
  pvVar2 = mpp_osal_calloc("hal_jpege_v540c_init",0x810);
  *(void **)((long)hal + 0x70) = pvVar2;
  pvVar2 = mpp_osal_calloc("hal_jpege_v540c_init",0x28);
  *(void **)((long)hal + 0xb8) = pvVar2;
  *(MppEncCfgSet **)((long)hal + 0xa0) = cfg->cfg;
  *(undefined4 *)((long)hal + 0x90) = 0;
  *(undefined4 *)((long)hal + 0xa8) = 1;
  cfg->type = VPU_CLIENT_RKVENC;
  MVar1 = mpp_dev_init(&cfg->dev,cfg->type);
  if (MVar1 == MPP_OK) {
    *(MppDev *)((long)hal + 0x68) = cfg->dev;
    jpege_bits_init((JpegeBits *)((long)hal + 0xe0));
    if ((*(long *)((long)hal + 0xe0) == 0) &&
       (_mpp_log_l(2,"hal_jpege_v540c","Assertion %s failed at %s:%d\n",(char *)0x0,"ctx->bits",
                   "hal_jpege_v540c_init",0x62), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if ((hal_jpege_debug & 1) != 0) {
      _mpp_log_l(4,"hal_jpege_v540c","(%d) leave\n","hal_jpege_v540c_init",100);
    }
  }
  else {
    _mpp_log_l(2,"hal_jpege_v540c","mpp_dev_init failed. ret: %d\n","hal_jpege_v540c_init",
               (ulong)(uint)MVar1);
  }
  return MVar1;
}

Assistant:

MPP_RET hal_jpege_v540c_init(void *hal, MppEncHalCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    jpegeV540cHalContext *ctx = (jpegeV540cHalContext *)hal;

    mpp_env_get_u32("hal_jpege_debug", &hal_jpege_debug, 0);

    hal_jpege_enter();

    ctx->reg_out  = mpp_calloc(JpegV540cStatus, 1);
    ctx->regs           = mpp_calloc(JpegV540cRegSet, 1);
    ctx->input_fmt      = mpp_calloc(VepuFmtCfg, 1);
    ctx->cfg            = cfg->cfg;

    ctx->frame_cnt = 0;
    ctx->enc_mode = 1;
    cfg->type = VPU_CLIENT_RKVENC;
    ret = mpp_dev_init(&cfg->dev, cfg->type);
    if (ret) {
        mpp_err_f("mpp_dev_init failed. ret: %d\n", ret);
        return ret;
    }

    ctx->dev = cfg->dev;
    jpege_bits_init(&ctx->bits);
    mpp_assert(ctx->bits);

    hal_jpege_leave();
    return ret;
}